

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrString.h
# Opt level: O0

string<wchar_t> * __thiscall
irr::core::string<wchar_t>::subString(string<wchar_t> *this,u32 begin,s32 length,bool make_lower)

{
  u32 uVar1;
  int in_ECX;
  uint in_EDX;
  ulong in_RSI;
  string<wchar_t> *in_RDI;
  byte in_R8B;
  string<wchar_t> *o;
  stl_type *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  uint in_stack_ffffffffffffffa4;
  string<wchar_t> *in_stack_ffffffffffffffc0;
  
  if ((in_ECX < 1) ||
     (uVar1 = size((string<wchar_t> *)0x3aaa2f), in_stack_ffffffffffffffa4 = in_EDX, uVar1 <= in_EDX
     )) {
    string<char>((string<wchar_t> *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 (char *)in_stack_ffffffffffffff98);
  }
  else {
    ::std::__cxx11::wstring::substr((ulong)&stack0xffffffffffffffc0,in_RSI);
    string((string<wchar_t> *)CONCAT44(in_EDX,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff98);
    ::std::__cxx11::wstring::~wstring((wstring *)&stack0xffffffffffffffc0);
    if ((in_R8B & 1) != 0) {
      string<wchar_t>::make_lower(in_stack_ffffffffffffffc0);
    }
  }
  return in_RDI;
}

Assistant:

string<T> subString(u32 begin, s32 length, bool make_lower = false) const
	{
		// if start after string
		// or no proper substring length
		if ((length <= 0) || (begin >= size()))
			return string<T>("");

		string<T> o = str.substr(begin, length);
		if (make_lower)
			o.make_lower();
		return o;
	}